

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O3

pair<llvm::StringMapIterator<llvm::cl::Option_*>,_bool> __thiscall
llvm::StringMap<llvm::cl::Option*,llvm::MallocAllocator>::try_emplace<llvm::cl::Option*>
          (StringMap<llvm::cl::Option*,llvm::MallocAllocator> *this,StringRef Key,Option **Args)

{
  StringMapEntryBase **ppSVar1;
  int iVar2;
  uint uVar3;
  StringMapEntryBase *pSVar4;
  StringMapEntry<llvm::cl::Option_*> *pSVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  SVar7;
  Option **in_R8;
  pair<llvm::StringMapIterator<llvm::cl::Option_*>,_bool> pVar8;
  StringRef Key_00;
  
  uVar3 = StringMapImpl::LookupBucketFor((StringMapImpl *)this,Key);
  SVar7.Ptr = (StringMapEntryBase **)(*(long *)this + (ulong)uVar3 * 8);
  pSVar4 = *SVar7.Ptr;
  if (pSVar4 == (StringMapEntryBase *)0xfffffffffffffff8) {
    *(int *)(this + 0x10) = *(int *)(this + 0x10) + -1;
  }
  else if (pSVar4 != (StringMapEntryBase *)0x0) {
    while ((pSVar4 == (StringMapEntryBase *)0x0 ||
           (pSVar4 == (StringMapEntryBase *)0xfffffffffffffff8))) {
      ppSVar1 = SVar7.Ptr + 1;
      SVar7.Ptr = SVar7.Ptr + 1;
      pSVar4 = *ppSVar1;
    }
    uVar6 = 0;
    goto LAB_00170942;
  }
  Key_00.Length = (size_t)(this + 0x18);
  Key_00.Data = (char *)Key.Length;
  pSVar5 = StringMapEntry<llvm::cl::Option*>::Create<llvm::MallocAllocator,llvm::cl::Option*>
                     ((StringMapEntry<llvm::cl::Option*> *)Key.Data,Key_00,(MallocAllocator *)Args,
                      in_R8);
  *SVar7.Ptr = &pSVar5->super_StringMapEntryBase;
  iVar2 = *(int *)(this + 0xc);
  *(int *)(this + 0xc) = iVar2 + 1;
  if (*(uint *)(this + 8) < (uint)(iVar2 + 1 + *(int *)(this + 0x10))) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0x196,
                  "std::pair<iterator, bool> llvm::StringMap<llvm::cl::Option *>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = llvm::cl::Option *, AllocatorTy = llvm::MallocAllocator, ArgsTy = <llvm::cl::Option *>]"
                 );
  }
  uVar3 = StringMapImpl::RehashTable((StringMapImpl *)this,uVar3);
  for (SVar7.Ptr = (StringMapEntryBase **)((ulong)uVar3 * 8 + *(long *)this);
      (*SVar7.Ptr == (StringMapEntryBase *)0x0 ||
      (*SVar7.Ptr == (StringMapEntryBase *)0xfffffffffffffff8)); SVar7.Ptr = SVar7.Ptr + 1) {
  }
  uVar6 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_00170942:
  pVar8._8_8_ = uVar6;
  pVar8.first.
  super_StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  .Ptr = (StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
          )(StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
            )SVar7.Ptr;
  return pVar8;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }